

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.c
# Opt level: O0

int uv_pipe_listen(uv_pipe_t *handle,int backlog,uv_connection_cb cb)

{
  int iVar1;
  int *piVar2;
  uv_connection_cb cb_local;
  int backlog_local;
  uv_pipe_t *handle_local;
  
  if ((handle->io_watcher).fd == -1) {
    handle_local._4_4_ = -0x16;
  }
  else {
    iVar1 = listen((handle->io_watcher).fd,backlog);
    if (iVar1 == 0) {
      handle->connection_cb = cb;
      (handle->io_watcher).cb = uv__server_io;
      uv__io_start(handle->loop,&handle->io_watcher,1);
      handle_local._4_4_ = 0;
    }
    else {
      piVar2 = __errno_location();
      handle_local._4_4_ = -*piVar2;
    }
  }
  return handle_local._4_4_;
}

Assistant:

int uv_pipe_listen(uv_pipe_t* handle, int backlog, uv_connection_cb cb) {
  if (uv__stream_fd(handle) == -1)
    return -EINVAL;

#if defined(__MVS__)
  /* On zOS, backlog=0 has undefined behaviour */
  if (backlog == 0)
    backlog = 1;
  else if (backlog < 0)
    backlog = SOMAXCONN;
#endif

  if (listen(uv__stream_fd(handle), backlog))
    return -errno;

  handle->connection_cb = cb;
  handle->io_watcher.cb = uv__server_io;
  uv__io_start(handle->loop, &handle->io_watcher, POLLIN);
  return 0;
}